

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  HighsInt *pHVar1;
  int iVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  long lVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  ulong uVar9;
  HighsInt *pHVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  _DistanceType __len;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int local_88;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  __cmp;
  anon_class_8_1_8991fb9c local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  long local_40;
  anon_class_8_1_8991fb9c comp_local;
  
  local_68._M_current = end._M_current + -1;
  local_50._M_current = end._M_current + -2;
  local_58._M_current = end._M_current + -3;
  comp_local.this = comp.this;
  local_88 = bad_allowed;
LAB_002dc824:
  do {
    lVar7 = (long)end._M_current - (long)begin._M_current;
    uVar12 = lVar7 >> 2;
    if ((long)uVar12 < 0x18) {
      if ((leftmost & 1U) == 0) {
        if (begin._M_current != end._M_current) {
          local_70.this = comp.this;
          while (pHVar10 = begin._M_current + 1, pHVar10 != end._M_current) {
            bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_70,begin._M_current[1],*begin._M_current);
            begin._M_current = pHVar10;
            if (bVar6) {
              HVar3 = *pHVar10;
              do {
                pHVar1 = pHVar10 + -2;
                *pHVar10 = pHVar10[-1];
                pHVar10 = pHVar10 + -1;
                bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                  (&local_70,HVar3,*pHVar1);
              } while (bVar6);
              *pHVar10 = HVar3;
            }
          }
        }
      }
      else if (begin._M_current != end._M_current) {
        lVar7 = 4;
        _Var8._M_current = begin._M_current;
        local_70.this = comp.this;
        while (pHVar10 = _Var8._M_current + 1, pHVar10 != end._M_current) {
          bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_70,_Var8._M_current[1],*_Var8._M_current);
          if (bVar6) {
            HVar3 = *pHVar10;
            lVar15 = lVar7;
            do {
              *(undefined4 *)((long)begin._M_current + lVar15) =
                   *(undefined4 *)((long)begin._M_current + lVar15 + -4);
              _Var8._M_current = begin._M_current;
              if (lVar15 == 4) goto LAB_002dcd0e;
              bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                (&local_70,HVar3,*(HighsInt *)((long)begin._M_current + lVar15 + -8)
                                );
              lVar15 = lVar15 + -4;
            } while (bVar6);
            _Var8._M_current = (HighsInt *)(lVar15 + (long)begin._M_current);
LAB_002dcd0e:
            *_Var8._M_current = HVar3;
          }
          lVar7 = lVar7 + 4;
          _Var8._M_current = pHVar10;
        }
      }
      return;
    }
    uVar9 = uVar12 >> 1;
    _Var8._M_current = begin._M_current + uVar9;
    local_40 = lVar7;
    if (uVar12 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                (_Var8,begin,local_68,comp);
    }
    else {
      local_60._M_current = _Var8._M_current;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                (begin,_Var8,local_68,comp);
      local_48._M_current = begin._M_current + (uVar9 - 1);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),local_48,local_50,comp);
      piVar14 = begin._M_current + uVar9;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar14 + 1),
                 local_58,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                (local_48,local_60,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar14 + 1),
                 comp);
      iVar2 = *begin._M_current;
      *begin._M_current = *piVar14;
      *piVar14 = iVar2;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&comp_local,begin._M_current[-1],*begin._M_current), !bVar6)) {
      HVar3 = *begin._M_current;
      lVar7 = 0;
      local_70.this = comp.this;
      do {
        bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_70,HVar3,*(HighsInt *)((long)end._M_current + lVar7 + -4));
        lVar7 = lVar7 + -4;
      } while (bVar6);
      pHVar10 = (HighsInt *)(lVar7 + (long)end._M_current);
      _Var8._M_current = begin._M_current;
      if (lVar7 == -4) {
        do {
          if (pHVar10 <= _Var8._M_current) break;
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_70,HVar3,*pHVar1);
        } while (!bVar6);
      }
      else {
        do {
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_70,HVar3,*pHVar1);
        } while (!bVar6);
      }
      while (_Var8._M_current < pHVar10) {
        HVar4 = *_Var8._M_current;
        *_Var8._M_current = *pHVar10;
        *pHVar10 = HVar4;
        do {
          pHVar1 = pHVar10 + -1;
          pHVar10 = pHVar10 + -1;
          bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_70,HVar3,*pHVar1);
        } while (bVar6);
        do {
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_70,HVar3,*pHVar1);
        } while (!bVar6);
      }
      *begin._M_current = *pHVar10;
      *pHVar10 = HVar3;
      begin._M_current = pHVar10 + 1;
      goto LAB_002dc824;
    }
    HVar3 = *begin._M_current;
    lVar7 = 0;
    local_70.this = comp.this;
    do {
      bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                        (&local_70,*(HighsInt *)((long)begin._M_current + lVar7 + 4),HVar3);
      lVar7 = lVar7 + 4;
    } while (bVar6);
    _Var8._M_current = begin._M_current + lVar7;
    _Var11._M_current = end._M_current;
    _Var5._M_current = _Var8._M_current;
    if (lVar7 == 4) {
      do {
        piVar14 = _Var11._M_current;
        if (_Var11._M_current <= _Var8._M_current) break;
        pHVar10 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_70,*pHVar10,HVar3);
        piVar14 = _Var11._M_current;
      } while (!bVar6);
    }
    else {
      do {
        pHVar10 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_70,*pHVar10,HVar3);
        piVar14 = _Var11._M_current;
      } while (!bVar6);
    }
    while (local_60._M_current = _Var5._M_current, _Var8._M_current < _Var11._M_current) {
      iVar2 = *_Var8._M_current;
      *_Var8._M_current = *_Var11._M_current;
      *_Var11._M_current = iVar2;
      do {
        pHVar10 = _Var8._M_current + 1;
        _Var8._M_current = _Var8._M_current + 1;
        bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_70,*pHVar10,HVar3);
      } while (bVar6);
      do {
        pHVar10 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar6 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_70,*pHVar10,HVar3);
        _Var5._M_current = local_60._M_current;
      } while (!bVar6);
    }
    _Var11._M_current = _Var8._M_current + -1;
    *begin._M_current = _Var8._M_current[-1];
    _Var8._M_current[-1] = HVar3;
    uVar13 = (long)_Var11._M_current - (long)begin._M_current >> 2;
    uVar9 = (long)end._M_current - (long)_Var8._M_current >> 2;
    if (((long)uVar13 < (long)(uVar12 >> 3)) || ((long)uVar9 < (long)(uVar12 >> 3))) {
      local_88 = local_88 + -1;
      if (local_88 == 0) {
        uVar9 = uVar12 - 2 >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                    (begin,uVar9,uVar12,begin._M_current[uVar9],
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
                      )comp.this);
          bVar6 = uVar9 != 0;
          uVar9 = uVar9 - 1;
          lVar7 = local_40;
        } while (bVar6);
        while (_Var8._M_current = local_68._M_current, 4 < lVar7) {
          iVar2 = *local_68._M_current;
          *local_68._M_current = *begin._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                    (begin,0,lVar7 + -4 >> 2,iVar2,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
                      )comp.this);
          local_68._M_current = _Var8._M_current + -1;
          lVar7 = lVar7 + -4;
        }
        return;
      }
      if (0x17 < (long)uVar13) {
        iVar2 = *begin._M_current;
        uVar12 = uVar13 & 0xfffffffffffffffc;
        *begin._M_current = *(begin._M_current + uVar12);
        *(begin._M_current + uVar12) = iVar2;
        iVar2 = _Var8._M_current[-2];
        _Var8._M_current[-2] = *(_Var8._M_current + (-4 - uVar12));
        *(_Var8._M_current + (-4 - uVar12)) = iVar2;
        if (0x80 < uVar13) {
          uVar13 = uVar13 >> 2;
          iVar2 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar13 + 1];
          begin._M_current[uVar13 + 1] = iVar2;
          iVar2 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar13 + 2];
          begin._M_current[uVar13 + 2] = iVar2;
          iVar2 = _Var8._M_current[-3];
          _Var8._M_current[-3] = _Var8._M_current[~uVar13 - 1];
          _Var8._M_current[~uVar13 - 1] = iVar2;
          iVar2 = _Var8._M_current[-4];
          _Var8._M_current[-4] = _Var8._M_current[-uVar13 + -3];
          _Var8._M_current[-uVar13 + -3] = iVar2;
        }
      }
      if (0x17 < (long)uVar9) {
        uVar12 = uVar9 & 0xfffffffffffffffc;
        iVar2 = *_Var8._M_current;
        *_Var8._M_current = *(_Var8._M_current + uVar12);
        *(_Var8._M_current + uVar12) = iVar2;
        iVar2 = end._M_current[-1];
        end._M_current[-1] = *(end._M_current - uVar12);
        *(end._M_current - uVar12) = iVar2;
        if (0x80 < uVar9) {
          uVar9 = uVar9 >> 2;
          iVar2 = _Var8._M_current[1];
          _Var8._M_current[1] = _Var8._M_current[uVar9 + 1];
          _Var8._M_current[uVar9 + 1] = iVar2;
          iVar2 = _Var8._M_current[2];
          _Var8._M_current[2] = _Var8._M_current[uVar9 + 2];
          _Var8._M_current[uVar9 + 2] = iVar2;
          iVar2 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar9];
          end._M_current[~uVar9] = iVar2;
          iVar2 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar9];
          end._M_current[-2 - uVar9] = iVar2;
        }
      }
    }
    else if (((piVar14 <= local_60._M_current) &&
             (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                                (begin,_Var11,comp), bVar6)) &&
            (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0>
                               (_Var8,end,comp), bVar6)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
              (begin,_Var11,comp,local_88,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var8._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }